

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void gimage::loadView(View *view,char *name,char *spath,bool verbose)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  long lVar7;
  Camera *this;
  ImageIO *this_00;
  ImageU8 *image_00;
  float *pfVar8;
  byte in_CL;
  Image<float,_gimage::PixelTraits<float>_> *a;
  char *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *this_01;
  View *in_RDI;
  bool in_stack_000000ef;
  char *in_stack_000000f0;
  char *in_stack_000000f8;
  string *in_stack_00000100;
  Exception *ex_1;
  double s;
  ImageU16 image2;
  Exception *anon_var_0_1;
  ImageU8 image;
  int iscale;
  string imagename;
  float *v;
  long i_2;
  long k_1;
  float dscale;
  float offset;
  float scale;
  exception *anon_var_0;
  long i_1;
  long k;
  float inv;
  ImageFloat depth;
  float step;
  Exception *ex2;
  Exception *ex;
  Properties prop;
  Camera *camera;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long h;
  long w;
  long y;
  long x;
  int ds;
  undefined8 in_stack_fffffffffffffba8;
  View *in_stack_fffffffffffffbb0;
  ImageFloat *in_stack_fffffffffffffbb8;
  View *in_stack_fffffffffffffbc0;
  Camera *in_stack_fffffffffffffbe8;
  View *in_stack_fffffffffffffbf0;
  long in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  float *in_stack_fffffffffffffc08;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc30;
  store_t_conflict in_stack_fffffffffffffc34;
  long in_stack_fffffffffffffc38;
  long in_stack_fffffffffffffc40;
  int ds_00;
  char *in_stack_fffffffffffffc48;
  ImageFloat *in_stack_fffffffffffffc50;
  long in_stack_fffffffffffffc70;
  long in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffd44;
  Properties *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd74;
  undefined2 uVar9;
  string *in_stack_fffffffffffffd78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  Image<float,_gimage::PixelTraits<float>_> *local_260;
  long local_258;
  float local_24c;
  float local_248;
  float local_244;
  long local_200;
  float *in_stack_fffffffffffffe08;
  char *defvalue;
  undefined4 in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  Properties *in_stack_fffffffffffffe20;
  string local_138 [32];
  string local_118 [23];
  undefined1 in_stack_fffffffffffffeff;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  Properties *in_stack_ffffffffffffff10;
  string local_d8 [32];
  string local_b8 [32];
  ulong local_98;
  allocator local_79;
  string local_78 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  uint local_20;
  byte local_19;
  char *local_10;
  View *local_8;
  
  uVar9 = (undefined2)((uint)in_stack_fffffffffffffd74 >> 0x10);
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  View::clear(in_stack_fffffffffffffbb0);
  local_20 = 1;
  local_28 = 0;
  local_30 = 0;
  local_38 = -1;
  local_40 = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19047f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_10,&local_79);
  gutil::split(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(char)((ushort)uVar9 >> 8),
               SUB21(uVar9,0));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_98 = 1;
  while( true ) {
    uVar1 = local_98;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_58);
    iVar3 = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
    if (sVar4 <= uVar1) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_58,local_98);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x3);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_58,local_98);
      std::__cxx11::string::substr((ulong)local_b8,(ulong)pvVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      lVar7 = atol(pcVar6);
      local_20 = (uint)lVar7;
      std::__cxx11::string::~string(local_b8);
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_58,local_98);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x2);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_58,local_98);
      std::__cxx11::string::substr((ulong)local_d8,(ulong)pvVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_28 = atol(pcVar6);
      std::__cxx11::string::~string(local_d8);
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_58,local_98);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x2);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_58,local_98);
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff08,(ulong)pvVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_30 = atol(pcVar6);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_58,local_98);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x2);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_58,local_98);
      std::__cxx11::string::substr((ulong)local_118,(ulong)pvVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_38 = atol(pcVar6);
      std::__cxx11::string::~string(local_118);
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_58,local_98);
    iVar3 = std::__cxx11::string::compare((ulong)pvVar5,0,(char *)0x2);
    if (iVar3 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_58,local_98);
      std::__cxx11::string::substr((ulong)local_138,(ulong)pvVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_40 = atol(pcVar6);
      std::__cxx11::string::~string(local_138);
    }
    local_98 = local_98 + 1;
  }
  gutil::Properties::Properties((Properties *)0x1908f1);
  loadViewProperties(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     (bool)in_stack_fffffffffffffeff);
  this = (Camera *)operator_new(0x118);
  gmath::PinholeCamera::PinholeCamera
            ((PinholeCamera *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             in_stack_fffffffffffffd48,in_stack_fffffffffffffd44);
  gutil::Properties::getValue<float>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  View::setDepthStep(local_8,1.0);
  (*this->_vptr_Camera[4])(this,(ulong)local_20);
  if ((local_38 < 1) &&
     (in_stack_fffffffffffffc70 = gmath::Camera::getWidth(this), 0 < in_stack_fffffffffffffc70)) {
    local_38 = local_38 - local_28;
  }
  if ((local_40 < 1) && (lVar7 = gmath::Camera::getHeight(this), 0 < lVar7)) {
    local_40 = local_40 - local_30;
  }
  (*this->_vptr_Camera[5])(this,local_28,local_30,local_38,local_40);
  View::setCamera(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (this != (Camera *)0x0) {
    (*this->_vptr_Camera[1])();
  }
  Image<float,_gimage::PixelTraits<float>_>::Image
            ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffbc0,
             (long)in_stack_fffffffffffffbb8,(long)in_stack_fffffffffffffbb0,iVar3);
  this_00 = getImageIO();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_58,0);
  std::__cxx11::string::c_str();
  a = (Image<float,_gimage::PixelTraits<float>_> *)((int)local_20 * local_38);
  this_01 = (Image<float,_gimage::PixelTraits<float>_> *)((int)local_20 * local_40);
  ImageIO::load(this_00,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                (int)((ulong)in_stack_fffffffffffffc40 >> 0x20),in_stack_fffffffffffffc38,
                CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                in_stack_fffffffffffffc70,in_stack_fffffffffffffc78);
  gutil::Properties::getValue<float>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (char *)in_stack_fffffffffffffe08);
  pcVar6 = (char *)0x0;
  while (defvalue = pcVar6,
        image_00 = (ImageU8 *)
                   Image<float,_gimage::PixelTraits<float>_>::getHeight
                             ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18)
        , (long)pcVar6 < (long)image_00) {
    local_200 = 0;
    while (in_stack_fffffffffffffc38 = local_200,
          in_stack_fffffffffffffc40 =
               Image<float,_gimage::PixelTraits<float>_>::getWidth
                         ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18),
          in_stack_fffffffffffffc38 < in_stack_fffffffffffffc40) {
      in_stack_fffffffffffffc34 =
           Image<float,_gimage::PixelTraits<float>_>::get
                     ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18,
                      local_200,(long)defvalue,0);
      if ((in_stack_fffffffffffffc34 == in_stack_fffffffffffffe14) &&
         (!NAN(in_stack_fffffffffffffc34) && !NAN(in_stack_fffffffffffffe14))) {
        Image<float,_gimage::PixelTraits<float>_>::setInvalid
                  ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffbc0,
                   (long)in_stack_fffffffffffffbb8,(long)this_01,(long)a);
      }
      local_200 = local_200 + 1;
    }
    pcVar6 = defvalue + 1;
  }
  if (1 < (int)local_20) {
    downscaleImage<float>(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
    Image<float,_gimage::PixelTraits<float>_>::operator=(this_01,a);
    Image<float,_gimage::PixelTraits<float>_>::~Image
              ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffbc0);
  }
  gutil::Properties::getValue<float>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),defvalue);
  gutil::Properties::getValue<float>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),defvalue);
  ds_00 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  iVar3 = (int)((ulong)a >> 0x20);
  if ((((1 < (int)local_20) || (local_244 != 1.0)) || (NAN(local_244))) ||
     ((local_248 != 0.0 || (NAN(local_248))))) {
    local_24c = 1.0;
    if (1 < (int)local_20) {
      local_24c = 1.0 / (float)(int)local_20;
    }
    local_258 = 0;
    while( true ) {
      lVar7 = Image<float,_gimage::PixelTraits<float>_>::getHeight
                        ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18);
      ds_00 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
      iVar3 = (int)((ulong)a >> 0x20);
      if (lVar7 <= local_258) break;
      local_260 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
      while (in_stack_fffffffffffffc10 = local_260,
            lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth
                              ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18
                              ), (long)in_stack_fffffffffffffc10 < lVar7) {
        pfVar8 = Image<float,_gimage::PixelTraits<float>_>::getPtr
                           ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18,
                            (long)local_260,local_258,0);
        in_stack_fffffffffffffc08 = pfVar8;
        bVar2 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                          (this_01,(store_t_conflict)((ulong)a >> 0x20));
        in_stack_fffffffffffffc04 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc04);
        if (bVar2) {
          Image<float,_gimage::PixelTraits<float>_>::set
                    ((Image<float,_gimage::PixelTraits<float>_> *)&stack0xfffffffffffffe18,
                     (long)local_260,local_258,0,(local_244 * *pfVar8 + local_248) * local_24c);
        }
        local_260 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_260->depth + 1);
      }
      local_258 = local_258 + 1;
    }
  }
  View::setDepthImage(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_fffffffffffffc10,(long)in_stack_fffffffffffffc08,
             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
            );
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd78);
  getViewImageName(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000ef);
  lVar7 = std::__cxx11::string::size();
  if (lVar7 != 0) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              (&in_stack_fffffffffffffbc0->image,(long)in_stack_fffffffffffffbb8,(long)this_01,iVar3
              );
    getImageIO();
    std::__cxx11::string::c_str();
    ImageIO::load(this_00,image_00,pcVar6,ds_00,in_stack_fffffffffffffc38,
                  CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc70,in_stack_fffffffffffffc78);
    View::setImage(in_stack_fffffffffffffbc0,(ImageU8 *)in_stack_fffffffffffffbb8);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              (&in_stack_fffffffffffffbc0->image);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  Image<float,_gimage::PixelTraits<float>_>::~Image
            ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffbc0);
  gutil::Properties::~Properties((Properties *)0x191792);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbc0);
  return;
}

Assistant:

void loadView(View &view, const char *name, const char *spath, bool verbose)
{
  view.clear();

  // get optionally specified downscale factor and image part

  int  ds=1;
  long x=0, y=0, w=-1, h=-1;
  std::vector<std::string> list;

  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 3, "ds=") == 0)
    {
      ds=atol(list[i].substr(3).c_str());
    }

    if (list[i].compare(0, 2, "x=") == 0)
    {
      x=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "y=") == 0)
    {
      y=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "w=") == 0)
    {
      w=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "h=") == 0)
    {
      h=atol(list[i].substr(2).c_str());
    }
  }

  // load camera

  gmath::Camera *camera=0;
  gutil::Properties prop;

  loadViewProperties(prop, name, spath, verbose);

  try
  {
    camera=new gmath::PinholeCamera(prop);
  }
  catch (gutil::Exception &ex)
  {
    try
    {
      camera=new gmath::OrthoCamera(prop);
    }
    catch (gutil::Exception &ex2)
    {
      if (verbose)
      {
        std::cout << "Cannot create pinhole camera from properties because: " << ex.what() << std::endl;
        std::cout << "Cannot create ortho camera from properties because: " << ex2.what() << std::endl;
      }

      throw gutil::IOException("Cannot create camera object from properties");
    }
  }

  // optionally set depth step from properties

  float step=1.0f;
  prop.getValue("step", step, 1.0f);
  view.setDepthStep(step);

  // set downscale factor and select part

  camera->setDownscaled(ds);

  if (w <= 0 && camera->getWidth() > 0)
  {
    w-=x;
  }

  if (h <= 0 && camera->getHeight() > 0)
  {
    h-=y;
  }

  camera->setPart(x, y, w, h);

  view.setCamera(camera);

  delete camera;
  camera=0;

  // load disparity

  ImageFloat depth;
  getImageIO().load(depth, list[0].c_str(), 1, ds*x, ds*y, ds*w, ds*h);

  // consider value for invalid pixels (inf is default)

  try
  {
    float inv;
    prop.getValue("disp.inv", inv);

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        if (depth.get(i, k, 0) == inv)
        {
          depth.setInvalid(i, k, 0);
        }
      }
    }
  }
  catch (const std::exception &)
  { }

  // optionally downscale image

  if (ds > 1)
  {
    depth=downscaleImage(depth, ds);
  }

  // get optional scale and offset

  float scale, offset;

  prop.getValue("disp.scale", scale, "1");
  prop.getValue("disp.offset", offset, "0");

  // apply scale, offset and downscale factor if any of them is not the default

  if (ds > 1 || scale != 1 || offset != 0)
  {
    float dscale=1;
    if (ds > 1)
    {
      dscale=1.0f/ds;
    }

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        float *v=depth.getPtr(i, k, 0);

        if (depth.isValidS(*v))
        {
          depth.set(i, k, 0, (scale* *v+offset)*dscale);
        }

        v++;
      }
    }
  }

  // set depth image

  view.setDepthImage(depth);
  depth.setSize(0, 0, 0);

  // load image

  std::string imagename;
  int iscale=getViewImageName(imagename, name, spath, verbose);

  iscale*=ds;

  if (imagename.size() > 0)
  {
    ImageU8 image;

    try
    {
      getImageIO().load(image, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);
      view.setImage(image);
    }
    catch (gutil::Exception &)
    {
      // load 16 bit image and convert to 8 bit

      try
      {
        ImageU16 image2;
        getImageIO().load(image2, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);

        double s=image2.maxValue()/255.0;

        if (s != 0)
        {
          image2/=s;
        }

        image.setImageLimited(image2);
        image2.setSize(0, 0, 0);

        view.setImage(image);
      }
      catch (gutil::Exception &ex)
      {
        if (verbose)
        {
          std::cout << "Cannot load image: " << imagename << " (" << ex.what() << ")" << std::endl;
        }
      }
    }
  }
}